

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O3

learner<svm_params,_example> *
LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
          (free_ptr<svm_params> *dat,
          _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  svm_params *psVar1;
  learner<svm_params,_example> *plVar2;
  
  psVar1 = (dat->_M_t).super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_svm_params_*,_false>._M_head_impl;
  plVar2 = calloc_or_throw<LEARNER::learner<svm_params,example>>(1);
  *(undefined8 *)(plVar2 + 0xd8) = 1;
  *(code **)(plVar2 + 0x98) = noop;
  *(code **)(plVar2 + 0xb0) = noop;
  *(code **)(plVar2 + 0x10) = noop;
  *(code **)(plVar2 + 0x80) = noop_sl;
  *(svm_params **)(plVar2 + 0xb8) = psVar1;
  *(code **)(plVar2 + 200) = noop;
  *(code **)(plVar2 + 0x50) = noop_sensitivity;
  *(svm_params **)(plVar2 + 0x58) = psVar1;
  *(code **)(plVar2 + 0x68) = return_simple_example;
  *(size_t *)(plVar2 + 0xe0) = params_per_weight;
  *(svm_params **)(plVar2 + 0x18) = psVar1;
  *(_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr **)(plVar2 + 0x28) = learn;
  *(_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr **)(plVar2 + 0x38) = learn;
  *(_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr **)(plVar2 + 0x30) = predict;
  *(undefined8 *)(plVar2 + 0x40) = 0;
  *(undefined4 *)(plVar2 + 0xd0) = 0;
  plVar2[0xe8] = (learner<svm_params,_example>)0x0;
  (dat->_M_t).super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Head_base<0UL,_svm_params_*,_false>.
  _M_head_impl = (svm_params *)0x0;
  return plVar2;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}